

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testselectionwidget.cpp
# Opt level: O3

void set_obj_color_proc(Am_Object param_1,Am_Object *obj,Am_Value *new_value)

{
  char cVar1;
  uint uVar2;
  Am_Object AStack_38;
  Am_Object local_30;
  Am_Object local_28;
  
  Am_Object::Am_Object(&local_28,(Am_Object *)&Am_Line);
  cVar1 = Am_Object::Is_Instance_Of((Am_Object)obj);
  if (cVar1 == '\0') {
    Am_Object::Am_Object(&AStack_38,&freehand_line_proto);
    cVar1 = Am_Object::Is_Instance_Of((Am_Object)obj);
    if (cVar1 == '\0') {
      Am_Object::Am_Object(&local_30,(Am_Object *)&Am_Text);
      uVar2 = Am_Object::Is_Instance_Of((Am_Object)obj);
      Am_Object::~Am_Object(&local_30);
      Am_Object::~Am_Object(&AStack_38);
      Am_Object::~Am_Object(&local_28);
      uVar2 = uVar2 & 0xff | 0x6a;
      goto LAB_0010bf16;
    }
    Am_Object::~Am_Object(&AStack_38);
  }
  Am_Object::~Am_Object(&local_28);
  uVar2 = 0x6b;
LAB_0010bf16:
  Am_Object::Set((ushort)obj,(Am_Value *)(ulong)uVar2,(ulong)new_value);
  return;
}

Assistant:

Am_Define_Method(Am_Set_Object_Property_Value_Method, void, set_obj_color,
                 (Am_Object /* command_obj */, Am_Object obj,
                  Am_Value new_value))
{
  if (obj.Is_Instance_Of(Am_Line) || obj.Is_Instance_Of(freehand_line_proto) ||
      obj.Is_Instance_Of(Am_Text))
    obj.Set(Am_LINE_STYLE, new_value);
  else
    obj.Set(Am_FILL_STYLE, new_value);
}